

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

TSNode * ts_node__descendant_for_point_range
                   (TSNode *__return_storage_ptr__,TSNode self,TSPoint min,TSPoint max,
                   _Bool include_anonymous)

{
  SubtreeHeapData *pSVar1;
  TSNode *pTVar2;
  _Bool _Var3;
  uint uVar4;
  undefined7 extraout_var;
  TSNode *pTVar5;
  ulong uVar6;
  ulong uVar7;
  TSTree *_self;
  TSNode child;
  Subtree local_b8;
  TSTree *local_b0;
  uint32_t local_a8;
  uint uStack_a4;
  uint uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  TSSymbol *local_90;
  ulong local_88;
  Subtree *local_80;
  TSTree *local_78;
  TSTree *local_70;
  TSNode *local_68;
  ulong local_60;
  TSPoint local_58;
  TSNode local_50;
  
  uVar7 = self.context._4_8_;
  __return_storage_ptr__->id = self.id;
  __return_storage_ptr__->tree = self.tree;
  *(long *)__return_storage_ptr__->context = self.context._0_8_;
  *(long *)(__return_storage_ptr__->context + 2) = self.context._8_8_;
  local_60 = (ulong)min >> 0x20;
  _self = self.tree;
  local_68 = __return_storage_ptr__;
  local_58 = min;
  do {
    do {
      while( true ) {
        local_b8 = *self.id;
        local_b0 = self.tree;
        if ((((ulong)local_b8.ptr & 1) == 0) && ((local_b8.ptr)->child_count != 0)) {
          uVar6 = (ulong)((local_b8.ptr)->field_17).field_0.alias_sequence_id;
          if (uVar6 == 0) {
            local_90 = (TSSymbol *)0x0;
          }
          else {
            local_90 = (self.tree)->language->alias_sequences +
                       (self.tree)->language->max_alias_sequence_length * uVar6;
          }
          uStack_a4 = (uint)uVar7;
          uStack_a0 = (uint)(uVar7 >> 0x20);
          uStack_9c = 0;
          uStack_98 = 0;
          local_a8 = self.context[0];
        }
        else {
          local_b8.ptr = (SubtreeHeapData *)0x0;
          local_90 = (TSSymbol *)0x0;
          local_a8 = 0;
          uStack_a4 = 0;
          uStack_a0 = 0;
          uStack_9c = 0;
          uStack_98 = 0;
        }
        do {
          _Var3 = ts_node_child_iterator_next((NodeChildIterator *)&local_b8.data,&local_50);
          uVar7 = local_50.context._4_8_;
          self.context[0] = local_50.context[0];
          pTVar2 = local_68;
          if (!_Var3) {
            return (TSNode *)CONCAT71(extraout_var,_Var3);
          }
          pTVar5 = (TSNode *)CONCAT44(uStack_a0,uStack_a4);
        } while ((uStack_a4 <= max.row) &&
                ((uStack_a4 != max.row ||
                 (pTVar5 = (TSNode *)(ulong)uStack_a0, uStack_a0 <= max.column))));
        if (local_58.row < local_50.context[1]) {
          return pTVar5;
        }
        if (local_50.context[1] == local_58.row) {
          if ((uint)local_60 < local_50.context[2]) {
            return (TSNode *)((ulong)local_50.context._4_8_ >> 0x20);
          }
        }
        pSVar1 = *local_50.id;
        self.id = local_50.id;
        self.tree = local_50.tree;
        if (!include_anonymous) break;
        if (((ulong)pSVar1 & 1) == 0) {
          uVar4 = (uint)*(ushort *)&pSVar1->field_0x2c;
        }
        else {
          uVar4 = (uint)pSVar1 >> 1;
        }
        if ((uVar4 & 1) != 0 || local_50.context[3] != 0) goto LAB_0012b5f7;
      }
      if (((ulong)pSVar1 & 1) == 0) {
        if ((*(ushort *)&pSVar1->field_0x2c & 1) != 0) {
          uVar4 = (uint)(*(ushort *)&pSVar1->field_0x2c >> 1);
          goto LAB_0012b5bf;
        }
      }
      else if (((ulong)pSVar1 & 2) != 0) {
        uVar4 = (uint)pSVar1 >> 2;
LAB_0012b5bf:
        if ((uVar4 & 1) != 0) break;
      }
    } while (((local_50.context[3] == 0) || ((short)local_50.context[3] == -2)) ||
            (((local_50.context[3] & 0xffff) != 0xffff &&
             (((byte)(local_50.tree)->language->symbol_metadata[local_50.context[3] & 0xffff] & 2)
              == 0))));
LAB_0012b5f7:
    local_78 = local_50.tree;
    local_80 = (Subtree *)local_50.id;
    local_88 = (ulong)local_50.context[3];
    local_70 = _self;
    ts_tree_set_cached_parent(_self,&local_50,local_68);
    pTVar2->context[0] = self.context[0];
    *(ulong *)(pTVar2->context + 1) = uVar7;
    pTVar2->context[3] = (uint32_t)local_88;
    pTVar2->id = local_80;
    pTVar2->tree = local_78;
    self.id = local_80;
    self.tree = local_78;
    _self = local_70;
  } while( true );
}

Assistant:

static inline TSNode ts_node__descendant_for_point_range(TSNode self, TSPoint min,
                                                         TSPoint max,
                                                         bool include_anonymous) {
  TSNode node = self;
  TSNode last_visible_node = self;

  bool did_descend = true;
  while (did_descend) {
    did_descend = false;

    TSNode child;
    NodeChildIterator iterator = ts_node_iterate_children(&node);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (point_gt(iterator.position.extent, max)) {
        if (point_gt(ts_node_start_point(child), min)) break;
        node = child;
        if (ts_node__is_relevant(node, include_anonymous)) {
          ts_tree_set_cached_parent(self.tree, &child, &last_visible_node);
          last_visible_node = node;
        }
        did_descend = true;
        break;
      }
    }
  }

  return last_visible_node;
}